

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::UniformCase::assignUniforms
          (UniformCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,deUint32 programGL,Random *rnd)

{
  pointer pBVar1;
  ostringstream *poVar2;
  pointer pcVar3;
  ulong uVar4;
  pointer pVVar5;
  string *psVar6;
  GLint location;
  int iVar7;
  int iVar8;
  uint uVar9;
  DataType DVar10;
  deUint32 dVar11;
  int iVar12;
  int iVar13;
  GLenum GVar14;
  pointer pBVar15;
  long *plVar16;
  undefined8 *puVar17;
  char *pcVar18;
  size_t sVar19;
  bool bVar20;
  uint uVar21;
  int iVar22;
  ulong *puVar23;
  long *plVar24;
  long lVar25;
  uint uVar26;
  VarValue *value;
  VarValue *value_00;
  pointer pBVar27;
  int iVar28;
  VarValue *pVVar29;
  DataType *pDVar30;
  undefined8 uVar31;
  DataType scalarType;
  int iVar32;
  DataType *pDVar33;
  _Alloc_hider _Var34;
  GLsizei GVar35;
  ulong uVar36;
  uint uVar37;
  CallLogWrapper *this_00;
  byte bVar38;
  float fVar39;
  string curName;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
  valuesToAssign;
  string queryName;
  VarValue apiValue;
  VarValue result_2;
  GLboolean local_3f0;
  long *local_3b8;
  long local_3b0;
  long local_3a8;
  long lStack_3a0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
  local_398;
  long *local_380;
  undefined8 local_378;
  long local_370;
  undefined8 uStack_368;
  TestLog *local_360;
  deRandom *local_358;
  ulong *local_350;
  long local_348;
  ulong local_340;
  long lStack_338;
  uint local_32c;
  ulong *local_328;
  long local_320;
  ulong local_318 [2];
  CallLogWrapper *local_308;
  long *local_300 [2];
  long local_2f0 [2];
  string local_2e0;
  long local_2c0;
  VarValue *local_2b8;
  string *local_2b0;
  long *local_2a8 [2];
  long local_298 [2];
  DataType local_284;
  float local_280 [16];
  undefined1 local_240 [8];
  ostringstream local_238 [104];
  ios_base local_1d0 [8];
  ios_base local_1c8 [268];
  DataType local_bc;
  float local_b8 [16];
  undefined1 local_78 [72];
  
  bVar38 = 0;
  local_32c = *(uint *)&(this->super_CallLogWrapper).field_0x14;
  DVar10 = TYPE_UINT;
  if (-1 < (char)local_32c) {
    DVar10 = TYPE_FLOAT;
  }
  scalarType = TYPE_INT;
  if ((local_32c & 0x40) == 0) {
    scalarType = DVar10;
  }
  pBVar15 = (basicUniforms->
            super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(basicUniforms->
                              super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar15) >> 3) *
          0x286bca1b) {
    local_360 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_32c = local_32c & 4;
    uVar26 = local_32c >> 2;
    this_00 = &this->super_CallLogWrapper;
    local_2c0 = 0;
    local_358 = &rnd->m_rnd;
    local_308 = this_00;
    do {
      pBVar1 = pBVar15 + local_2c0;
      iVar22 = pBVar15[local_2c0].elemNdx;
      if ((((this->super_CallLogWrapper).field_0x15 & 1) == 0) || (pBVar15[local_2c0].elemNdx != 0))
      {
        local_300[0] = local_2f0;
        pcVar3 = (pBVar1->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_300,pcVar3,pcVar3 + (pBVar1->name)._M_string_length);
      }
      else {
        std::__cxx11::string::rfind((char)pBVar1,0x5b);
        std::__cxx11::string::substr((ulong)local_300,(ulong)pBVar1);
      }
      uVar21 = 1;
      if (-1 < iVar22) {
        uVar37 = *(uint *)&(this->super_CallLogWrapper).field_0x14;
        if ((uVar37 & 8) == 0) {
          if ((uVar37 & 0x10) != 0) {
            uVar21 = ~pBVar1->elemNdx * 2 & 2;
          }
        }
        else {
          uVar21 = 0;
          if (pBVar1->elemNdx == 0) {
            uVar21 = pBVar1->rootSize;
          }
        }
      }
      if (uVar21 == 0) {
        local_240 = (undefined1  [8])local_360;
        poVar2 = (ostringstream *)(local_240 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// Uniform ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,(pBVar1->name)._M_dataplus._M_p,(pBVar1->name)._M_string_length
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,
                   " is covered by another glProgramUniform*v() call to the same array",0x42);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base(local_1c8);
      }
      else {
        location = glu::CallLogWrapper::glGetUniformLocation
                             (this_00,programGL,(GLchar *)local_300[0]);
        iVar7 = glu::getDataTypeScalarSize(pBVar1->type);
        if (((this->super_CallLogWrapper).field_0x14 & 2) == 0) {
          bVar20 = false;
        }
        else {
          bVar20 = uVar21 == 1 &&
                   (pBVar1->type - TYPE_INT < 0xfffffff7 && pBVar1->type - TYPE_DOUBLE < 0xfffffff7)
          ;
        }
        local_398.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_398.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_398.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (0 < (int)uVar21) {
          local_2b0 = &pBVar1->rootName;
          local_2b8 = &pBVar1->finalValue;
          uVar37 = 0;
          do {
            psVar6 = local_2b0;
            if (iVar22 < 0) {
              local_3b8 = &local_3a8;
              pcVar3 = (pBVar1->name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3b8,pcVar3,pcVar3 + (pBVar1->name)._M_string_length);
            }
            else {
              std::__cxx11::string::rfind((char)local_2b0,0x5b);
              std::__cxx11::string::substr((ulong)local_2a8,(ulong)psVar6);
              plVar16 = (long *)std::__cxx11::string::append((char *)local_2a8);
              local_350 = &local_340;
              puVar23 = (ulong *)(plVar16 + 2);
              if ((ulong *)*plVar16 == puVar23) {
                local_340 = *puVar23;
                lStack_338 = plVar16[3];
              }
              else {
                local_340 = *puVar23;
                local_350 = (ulong *)*plVar16;
              }
              local_348 = plVar16[1];
              *plVar16 = (long)puVar23;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              iVar8 = pBVar1->elemNdx;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
              std::ostream::operator<<((ostringstream *)local_240,iVar8 + uVar37);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
              std::ios_base::~ios_base((ios_base *)(local_240 + 0x70));
              uVar36 = 0xf;
              if (local_350 != &local_340) {
                uVar36 = local_340;
              }
              if (uVar36 < (ulong)(local_320 + local_348)) {
                uVar36 = 0xf;
                if (local_328 != local_318) {
                  uVar36 = local_318[0];
                }
                if (uVar36 < (ulong)(local_320 + local_348)) goto LAB_0051c730;
                puVar17 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_328,0,(char *)0x0,(ulong)local_350);
              }
              else {
LAB_0051c730:
                puVar17 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_328);
              }
              local_380 = &local_370;
              plVar16 = puVar17 + 2;
              if ((long *)*puVar17 == plVar16) {
                local_370 = *plVar16;
                uStack_368 = puVar17[3];
              }
              else {
                local_370 = *plVar16;
                local_380 = (long *)*puVar17;
              }
              local_378 = puVar17[1];
              *puVar17 = plVar16;
              puVar17[1] = 0;
              *(undefined1 *)plVar16 = 0;
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_380);
              local_3b8 = &local_3a8;
              plVar24 = plVar16 + 2;
              if ((long *)*plVar16 == plVar24) {
                local_3a8 = *plVar24;
                lStack_3a0 = plVar16[3];
              }
              else {
                local_3a8 = *plVar24;
                local_3b8 = (long *)*plVar16;
              }
              local_3b0 = plVar16[1];
              *plVar16 = (long)plVar24;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
            }
            pBVar15 = pBVar1;
            if (iVar22 < 0) {
LAB_0051c906:
              pVVar29 = &pBVar15->finalValue;
              pDVar30 = &local_bc;
              for (lVar25 = 0x11; lVar25 != 0; lVar25 = lVar25 + -1) {
                *pDVar30 = pVVar29->type;
                pVVar29 = (VarValue *)((long)pVVar29 + (ulong)bVar38 * -8 + 4);
                pDVar30 = pDVar30 + (ulong)bVar38 * -2 + 1;
              }
              if (local_bc - TYPE_BOOL < 4) {
                uVar9 = glu::getDataTypeScalarSize(local_bc);
                DVar10 = scalarType;
                if (uVar9 != 1) {
                  DVar10 = glu::getDataTypeVector(scalarType,uVar9);
                }
                local_284 = DVar10;
                if (scalarType == TYPE_UINT) {
                  if (0 < (int)uVar9) {
                    uVar36 = 0;
                    do {
                      fVar39 = 0.0;
                      if (*(char *)((long)local_b8 + uVar36) == '\x01') {
                        dVar11 = deRandom_getUint32(local_358);
                        fVar39 = (float)(dVar11 % 10 + 1);
                      }
                      local_280[uVar36] = fVar39;
                      uVar36 = uVar36 + 1;
                    } while (uVar9 != uVar36);
                  }
                }
                else if (scalarType == TYPE_INT) {
                  if (0 < (int)uVar9) {
                    uVar36 = 0;
                    do {
                      if (*(char *)((long)local_b8 + uVar36) == '\x01') {
                        dVar11 = deRandom_getUint32(local_358);
                        local_280[uVar36] =
                             (float)((dVar11 % 0x15 - 10) + (uint)(dVar11 % 0x15 == 10));
                      }
                      else {
                        local_280[uVar36] = 0.0;
                      }
                      uVar36 = uVar36 + 1;
                    } while (uVar9 != uVar36);
                  }
                }
                else if ((scalarType == TYPE_FLOAT) && (0 < (int)uVar9)) {
                  uVar36 = 0;
                  do {
                    if (*(char *)((long)local_b8 + uVar36) == '\x01') {
                      fVar39 = deRandom_getFloat(local_358);
                      fVar39 = fVar39 * 20.0 + -10.0;
                      local_280[uVar36] = fVar39;
                      if ((fVar39 == 0.0) && (!NAN(fVar39))) {
                        local_280[uVar36] = 1.0;
                      }
                    }
                    else {
                      local_280[uVar36] = 0.0;
                    }
                    uVar36 = uVar36 + 1;
                  } while (uVar9 != uVar36);
                }
              }
              else if (local_bc - TYPE_SAMPLER_1D < 0x1e) {
                local_284 = TYPE_INT;
                local_280[0] = local_b8[0];
              }
              else {
                pDVar30 = &local_bc;
                pDVar33 = &local_284;
                for (lVar25 = 0x11; lVar25 != 0; lVar25 = lVar25 + -1) {
                  *pDVar33 = *pDVar30;
                  pDVar30 = pDVar30 + (ulong)bVar38 * -2 + 1;
                  pDVar33 = pDVar33 + (ulong)bVar38 * -2 + 1;
                }
              }
              DVar10 = local_284;
              if (local_284 - TYPE_INT < 0xfffffff7 && local_284 - TYPE_DOUBLE < 0xfffffff7 ||
                  local_32c == 0) {
                pDVar30 = &local_284;
                pDVar33 = (DataType *)local_240;
                for (lVar25 = 0x11; lVar25 != 0; lVar25 = lVar25 + -1) {
                  *pDVar33 = *pDVar30;
                  pDVar30 = pDVar30 + (ulong)bVar38 * -2 + 1;
                  pDVar33 = pDVar33 + (ulong)bVar38 * -2 + 1;
                }
              }
              else {
                iVar8 = glu::getDataTypeMatrixNumRows(local_284);
                uVar9 = glu::getDataTypeMatrixNumColumns(DVar10);
                iVar12 = glu::getDataTypeMatrixNumRows(DVar10);
                iVar13 = glu::getDataTypeMatrixNumColumns(DVar10);
                DVar10 = glu::getDataTypeMatrix(iVar12,iVar13);
                local_240._0_4_ = DVar10;
                if (0 < iVar8) {
                  iVar12 = 0;
                  iVar13 = 0;
                  do {
                    uVar36 = (ulong)uVar9;
                    iVar28 = iVar13;
                    iVar32 = iVar12;
                    if (0 < (int)uVar9) {
                      do {
                        *(float *)(local_240 + (long)iVar32 * 4 + 4) = local_280[iVar28];
                        iVar32 = iVar32 + 1;
                        iVar28 = iVar28 + iVar8;
                        uVar36 = uVar36 - 1;
                      } while (uVar36 != 0);
                    }
                    iVar13 = iVar13 + 1;
                    iVar12 = iVar12 + uVar9;
                  } while (iVar13 != iVar8);
                }
              }
              std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
              ::push_back(&local_398,(value_type *)local_240);
              if (pBVar1->type - TYPE_BOOL < 4) {
                local_240 = (undefined1  [8])local_360;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_240 + 8));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_240 + 8),"// Using type ",0xe);
                pcVar18 = glu::getDataTypeName(scalarType);
                if (pcVar18 == (char *)0x0) {
                  std::ios::clear((int)local_240 + 8 + (int)*(undefined8 *)(local_238._0_8_ + -0x18)
                                 );
                }
                else {
                  sVar19 = strlen(pcVar18);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_240 + 8),pcVar18,sVar19);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_240 + 8)," to set boolean value ",0x16);
                apiVarValueStr_abi_cxx11_((string *)local_78,(Functional *)&local_bc,value_00);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_240 + 8),(char *)local_78._0_8_,local_78._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_240 + 8)," for ",5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_240 + 8),(char *)local_3b8,local_3b0);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                uVar31 = local_78._16_8_;
                _Var34._M_p = (pointer)local_78._0_8_;
                if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
LAB_0051cddf:
                  operator_delete(_Var34._M_p,uVar31 + 1);
                }
              }
              else {
                if (0x1d < pBVar1->type - TYPE_SAMPLER_1D) goto LAB_0051ce08;
                local_240 = (undefined1  [8])local_360;
                poVar2 = (ostringstream *)(local_240 + 8);
                std::__cxx11::ostringstream::ostringstream(poVar2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2,"// Texture for the sampler uniform ",0x23);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2,(char *)local_3b8,local_3b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar2," will be filled with color ",0x1b);
                getSamplerFillValue((VarValue *)local_78,local_2b8);
                apiVarValueStr_abi_cxx11_(&local_2e0,(Functional *)local_78,value);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_240 + 8),local_2e0._M_dataplus._M_p,
                           local_2e0._M_string_length);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                uVar31 = local_2e0.field_2._M_allocated_capacity;
                _Var34._M_p = local_2e0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) goto LAB_0051cddf;
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_240 + 8));
              std::ios_base::~ios_base(local_1c8);
            }
            else {
              if (local_380 != &local_370) {
                operator_delete(local_380,local_370 + 1);
              }
              if (local_328 != local_318) {
                operator_delete(local_328,local_318[0] + 1);
              }
              if (iVar22 < 0) goto LAB_0051c906;
              if (local_350 != &local_340) {
                operator_delete(local_350,local_340 + 1);
              }
              if (local_2a8[0] != local_298) {
                operator_delete(local_2a8[0],local_298[0] + 1);
              }
              pBVar27 = (basicUniforms->
                        super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              pBVar15 = (basicUniforms->
                        super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              if (pBVar27 != pBVar15) {
                do {
                  iVar8 = std::__cxx11::string::compare((char *)pBVar27);
                  pBVar15 = pBVar27;
                  if (iVar8 == 0) break;
                  pBVar27 = pBVar27 + 1;
                  pBVar15 = (basicUniforms->
                            super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                } while (pBVar27 != pBVar15);
              }
              if (pBVar15 !=
                  (basicUniforms->
                  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                  )._M_impl.super__Vector_impl_data._M_finish) goto LAB_0051c906;
            }
LAB_0051ce08:
            if (local_3b8 != &local_3a8) {
              operator_delete(local_3b8,local_3a8 + 1);
            }
            uVar37 = uVar37 + 1;
          } while (uVar37 != uVar21);
        }
        this_00 = local_308;
        pVVar5 = local_398.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        DVar10 = (local_398.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                  ._M_impl.super__Vector_impl_data._M_start)->type;
        if (DVar10 - TYPE_FLOAT < 4) {
          if (bVar20) {
            switch(iVar7) {
            case 1:
              glu::CallLogWrapper::glProgramUniform1f
                        (local_308,programGL,location,
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0]);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x58c;
              pcVar18 = "glProgramUniform1f(programGL, location, ptr[0])";
              break;
            case 2:
              glu::CallLogWrapper::glProgramUniform2f
                        (local_308,programGL,location,
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1]);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x58d;
              pcVar18 = "glProgramUniform2f(programGL, location, ptr[0], ptr[1])";
              break;
            case 3:
              glu::CallLogWrapper::glProgramUniform3f
                        (local_308,programGL,location,
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[2]);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x58e;
              pcVar18 = "glProgramUniform3f(programGL, location, ptr[0], ptr[1], ptr[2])";
              break;
            case 4:
              glu::CallLogWrapper::glProgramUniform4f
                        (local_308,programGL,location,
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[0],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[1],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[2],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).floatV[3]);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x58f;
              pcVar18 = "glProgramUniform4f(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3])";
              break;
            default:
              goto switchD_0051ce77_default;
            }
            glu::checkError(dVar11,pcVar18,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                            ,iVar22);
            goto switchD_0051ce77_default;
          }
          lVar25 = ((long)local_398.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_398.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_240,iVar7 * lVar25,
                     (allocator_type *)&local_bc);
          uVar21 = (uint)((ulong)(local_238._0_8_ - (long)local_240) >> 2);
          if (0 < (int)uVar21) {
            uVar36 = 0;
            do {
              uVar4 = (ulong)(uint)((int)uVar36 >> 0x1f) << 0x20 | uVar36 & 0xffffffff;
              *(float *)((long)(qpTestLog **)local_240 + uVar36 * 4) =
                   pVVar5[(int)((long)uVar4 / (long)iVar7)].val.floatV
                   [(int)((long)uVar4 % (long)iVar7)];
              uVar36 = uVar36 + 1;
            } while ((uVar21 & 0x7fffffff) != uVar36);
          }
          GVar35 = (GLsizei)lVar25;
          switch(iVar7) {
          case 1:
            glu::CallLogWrapper::glProgramUniform1fv
                      (this_00,programGL,location,GVar35,(GLfloat *)local_240);
            dVar11 = glu::CallLogWrapper::glGetError(this_00);
            iVar22 = 0x59d;
            pcVar18 = 
            "glProgramUniform1fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 2:
            glu::CallLogWrapper::glProgramUniform2fv
                      (this_00,programGL,location,GVar35,(GLfloat *)local_240);
            dVar11 = glu::CallLogWrapper::glGetError(this_00);
            iVar22 = 0x59e;
            pcVar18 = 
            "glProgramUniform2fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 3:
            glu::CallLogWrapper::glProgramUniform3fv
                      (this_00,programGL,location,GVar35,(GLfloat *)local_240);
            dVar11 = glu::CallLogWrapper::glGetError(this_00);
            iVar22 = 0x59f;
            pcVar18 = 
            "glProgramUniform3fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          case 4:
            glu::CallLogWrapper::glProgramUniform4fv
                      (this_00,programGL,location,GVar35,(GLfloat *)local_240);
            dVar11 = glu::CallLogWrapper::glGetError(this_00);
            iVar22 = 0x5a0;
            pcVar18 = 
            "glProgramUniform4fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])";
            break;
          default:
            goto switchD_0051d057_default;
          }
          glu::checkError(dVar11,pcVar18,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,iVar22);
switchD_0051d057_default:
          if (local_240 != (undefined1  [8])0x0) {
            operator_delete((void *)local_240,local_238._8_8_ - (long)local_240);
          }
        }
        else {
          if (DVar10 - TYPE_FLOAT_MAT2 < 9 || DVar10 - TYPE_DOUBLE_MAT2 < 9) {
            lVar25 = ((long)local_398.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_398.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f;
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)local_240,iVar7 * lVar25,
                       (allocator_type *)&local_bc);
            uVar21 = (uint)((ulong)(local_238._0_8_ - (long)local_240) >> 2);
            if (0 < (int)uVar21) {
              uVar36 = 0;
              do {
                uVar4 = (ulong)(uint)((int)uVar36 >> 0x1f) << 0x20 | uVar36 & 0xffffffff;
                *(float *)((long)(qpTestLog **)local_240 + uVar36 * 4) =
                     pVVar5[(int)((long)uVar4 / (long)iVar7)].val.floatV
                     [(int)((long)uVar4 % (long)iVar7)];
                uVar36 = uVar36 + 1;
              } while ((uVar21 & 0x7fffffff) != uVar36);
            }
            GVar35 = (GLsizei)lVar25;
            local_3f0 = (GLboolean)uVar26;
            switch(pBVar1->type) {
            case TYPE_FLOAT_MAT2:
              glu::CallLogWrapper::glProgramUniformMatrix2fv
                        (this_00,programGL,location,GVar35,local_3f0,(GLfloat *)local_240);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5b1;
              pcVar18 = 
              "glProgramUniformMatrix2fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT2X3:
              glu::CallLogWrapper::glProgramUniformMatrix2x3fv
                        (this_00,programGL,location,GVar35,local_3f0,(GLfloat *)local_240);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5b4;
              pcVar18 = 
              "glProgramUniformMatrix2x3fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT2X4:
              glu::CallLogWrapper::glProgramUniformMatrix2x4fv
                        (this_00,programGL,location,GVar35,local_3f0,(GLfloat *)local_240);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5b5;
              pcVar18 = 
              "glProgramUniformMatrix2x4fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT3X2:
              glu::CallLogWrapper::glProgramUniformMatrix3x2fv
                        (this_00,programGL,location,GVar35,local_3f0,(GLfloat *)local_240);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5b6;
              pcVar18 = 
              "glProgramUniformMatrix3x2fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT3:
              glu::CallLogWrapper::glProgramUniformMatrix3fv
                        (this_00,programGL,location,GVar35,local_3f0,(GLfloat *)local_240);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5b2;
              pcVar18 = 
              "glProgramUniformMatrix3fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT3X4:
              glu::CallLogWrapper::glProgramUniformMatrix3x4fv
                        (this_00,programGL,location,GVar35,local_3f0,(GLfloat *)local_240);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5b7;
              pcVar18 = 
              "glProgramUniformMatrix3x4fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT4X2:
              glu::CallLogWrapper::glProgramUniformMatrix4x2fv
                        (this_00,programGL,location,GVar35,local_3f0,(GLfloat *)local_240);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5b8;
              pcVar18 = 
              "glProgramUniformMatrix4x2fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT4X3:
              glu::CallLogWrapper::glProgramUniformMatrix4x3fv
                        (this_00,programGL,location,GVar35,local_3f0,(GLfloat *)local_240);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5b9;
              pcVar18 = 
              "glProgramUniformMatrix4x3fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            case TYPE_FLOAT_MAT4:
              glu::CallLogWrapper::glProgramUniformMatrix4fv
                        (this_00,programGL,location,GVar35,local_3f0,(GLfloat *)local_240);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5b3;
              pcVar18 = 
              "glProgramUniformMatrix4fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
              ;
              break;
            default:
              goto switchD_0051d057_default;
            }
            glu::checkError(dVar11,pcVar18,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                            ,iVar22);
            goto switchD_0051d057_default;
          }
          if (DVar10 - TYPE_INT < 4) {
            if (!bVar20) {
              lVar25 = ((long)local_398.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_398.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_240,iVar7 * lVar25,
                         (allocator_type *)&local_bc);
              uVar21 = (uint)((ulong)(local_238._0_8_ - (long)local_240) >> 2);
              if (0 < (int)uVar21) {
                uVar36 = 0;
                do {
                  uVar4 = (ulong)(uint)((int)uVar36 >> 0x1f) << 0x20 | uVar36 & 0xffffffff;
                  *(float *)((long)(qpTestLog **)local_240 + uVar36 * 4) =
                       pVVar5[(int)((long)uVar4 / (long)iVar7)].val.floatV
                       [(int)((long)uVar4 % (long)iVar7)];
                  uVar36 = uVar36 + 1;
                } while ((uVar21 & 0x7fffffff) != uVar36);
              }
              GVar35 = (GLsizei)lVar25;
              switch(iVar7) {
              case 1:
                glu::CallLogWrapper::glProgramUniform1iv
                          (this_00,programGL,location,GVar35,(GLint *)local_240);
                dVar11 = glu::CallLogWrapper::glGetError(this_00);
                iVar22 = 0x5d7;
                pcVar18 = 
                "glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              case 2:
                glu::CallLogWrapper::glProgramUniform2iv
                          (this_00,programGL,location,GVar35,(GLint *)local_240);
                dVar11 = glu::CallLogWrapper::glGetError(this_00);
                iVar22 = 0x5d8;
                pcVar18 = 
                "glProgramUniform2iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              case 3:
                glu::CallLogWrapper::glProgramUniform3iv
                          (this_00,programGL,location,GVar35,(GLint *)local_240);
                dVar11 = glu::CallLogWrapper::glGetError(this_00);
                iVar22 = 0x5d9;
                pcVar18 = 
                "glProgramUniform3iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              case 4:
                glu::CallLogWrapper::glProgramUniform4iv
                          (this_00,programGL,location,GVar35,(GLint *)local_240);
                dVar11 = glu::CallLogWrapper::glGetError(this_00);
                iVar22 = 0x5da;
                pcVar18 = 
                "glProgramUniform4iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              default:
                goto switchD_0051d057_default;
              }
              glu::checkError(dVar11,pcVar18,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,iVar22);
              goto switchD_0051d057_default;
            }
            switch(iVar7) {
            case 1:
              glu::CallLogWrapper::glProgramUniform1i
                        (local_308,programGL,location,
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0]);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5c6;
              pcVar18 = "glProgramUniform1i(programGL, location, ptr[0])";
              break;
            case 2:
              glu::CallLogWrapper::glProgramUniform2i
                        (local_308,programGL,location,
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[1]);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5c7;
              pcVar18 = "glProgramUniform2i(programGL, location, ptr[0], ptr[1])";
              break;
            case 3:
              glu::CallLogWrapper::glProgramUniform3i
                        (local_308,programGL,location,
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[1],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[2]);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5c8;
              pcVar18 = "glProgramUniform3i(programGL, location, ptr[0], ptr[1], ptr[2])";
              break;
            case 4:
              glu::CallLogWrapper::glProgramUniform4i
                        (local_308,programGL,location,
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[0],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[1],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[2],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).intV[3]);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5c9;
              pcVar18 = "glProgramUniform4i(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3])";
              break;
            default:
              goto switchD_0051ce77_default;
            }
            glu::checkError(dVar11,pcVar18,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                            ,iVar22);
          }
          else if (DVar10 - TYPE_UINT < 4) {
            if (!bVar20) {
              lVar25 = ((long)local_398.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_398.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0xf0f0f0f0f0f0f0f;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_240,
                         iVar7 * lVar25,(allocator_type *)&local_bc);
              uVar21 = (uint)((ulong)(local_238._0_8_ - (long)local_240) >> 2);
              if (0 < (int)uVar21) {
                uVar36 = 0;
                do {
                  uVar4 = (ulong)(uint)((int)uVar36 >> 0x1f) << 0x20 | uVar36 & 0xffffffff;
                  *(float *)((long)(qpTestLog **)local_240 + uVar36 * 4) =
                       pVVar5[(int)((long)uVar4 / (long)iVar7)].val.floatV
                       [(int)((long)uVar4 % (long)iVar7)];
                  uVar36 = uVar36 + 1;
                } while ((uVar21 & 0x7fffffff) != uVar36);
              }
              GVar35 = (GLsizei)lVar25;
              switch(iVar7) {
              case 1:
                glu::CallLogWrapper::glProgramUniform1uiv
                          (this_00,programGL,location,GVar35,(GLuint *)local_240);
                dVar11 = glu::CallLogWrapper::glGetError(this_00);
                iVar22 = 0x5f9;
                pcVar18 = 
                "glProgramUniform1uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              case 2:
                glu::CallLogWrapper::glProgramUniform2uiv
                          (this_00,programGL,location,GVar35,(GLuint *)local_240);
                dVar11 = glu::CallLogWrapper::glGetError(this_00);
                iVar22 = 0x5fa;
                pcVar18 = 
                "glProgramUniform2uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              case 3:
                glu::CallLogWrapper::glProgramUniform3uiv
                          (this_00,programGL,location,GVar35,(GLuint *)local_240);
                dVar11 = glu::CallLogWrapper::glGetError(this_00);
                iVar22 = 0x5fb;
                pcVar18 = 
                "glProgramUniform3uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              case 4:
                glu::CallLogWrapper::glProgramUniform4uiv
                          (this_00,programGL,location,GVar35,(GLuint *)local_240);
                dVar11 = glu::CallLogWrapper::glGetError(this_00);
                iVar22 = 0x5fc;
                pcVar18 = 
                "glProgramUniform4uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                ;
                break;
              default:
                goto switchD_0051d057_default;
              }
              glu::checkError(dVar11,pcVar18,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,iVar22);
              goto switchD_0051d057_default;
            }
            switch(iVar7) {
            case 1:
              glu::CallLogWrapper::glProgramUniform1ui
                        (local_308,programGL,location,
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[0]);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5e8;
              pcVar18 = "glProgramUniform1ui(programGL, location, ptr[0])";
              break;
            case 2:
              glu::CallLogWrapper::glProgramUniform2ui
                        (local_308,programGL,location,
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[0],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[1]);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5e9;
              pcVar18 = "glProgramUniform2ui(programGL, location, ptr[0], ptr[1])";
              break;
            case 3:
              glu::CallLogWrapper::glProgramUniform3ui
                        (local_308,programGL,location,
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[0],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[1],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[2]);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5ea;
              pcVar18 = "glProgramUniform3ui(programGL, location, ptr[0], ptr[1], ptr[2])";
              break;
            case 4:
              glu::CallLogWrapper::glProgramUniform4ui
                        (local_308,programGL,location,
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[0],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[1],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[2],
                         ((local_398.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                           ._M_impl.super__Vector_impl_data._M_start)->val).uintV[3]);
              dVar11 = glu::CallLogWrapper::glGetError(this_00);
              iVar22 = 0x5eb;
              pcVar18 = "glProgramUniform4ui(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3])";
              break;
            default:
              goto switchD_0051ce77_default;
            }
            glu::checkError(dVar11,pcVar18,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                            ,iVar22);
          }
          else if (DVar10 - TYPE_SAMPLER_1D < 0x1e) {
            if (bVar20) {
              glu::CallLogWrapper::glProgramUniform1i
                        (local_308,programGL,location,(pBVar1->finalValue).val.intV[0]);
              GVar14 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar14,
                              "glProgramUniform1i(programGL, location, uniform.finalValue.val.samplerV.unit)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x605);
            }
            else {
              local_240._0_4_ = (pBVar1->finalValue).val.intV[0];
              glu::CallLogWrapper::glProgramUniform1iv
                        (local_308,programGL,location,
                         (int)((ulong)((long)local_398.
                                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_398.
                                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                         -0xf0f0f0f,(GLint *)local_240);
              GVar14 = glu::CallLogWrapper::glGetError(this_00);
              glu::checkError(GVar14,
                              "glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &unit)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x609);
            }
          }
        }
switchD_0051ce77_default:
        if (local_398.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_398.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_398.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_398.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (local_300[0] != local_2f0) {
        operator_delete(local_300[0],local_2f0[0] + 1);
      }
      local_2c0 = local_2c0 + 1;
      pBVar15 = (basicUniforms->
                super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (local_2c0 <
             (int)((ulong)((long)(basicUniforms->
                                 super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar15) >> 3)
             * 0x286bca1b);
  }
  return;
}

Assistant:

void UniformCase::assignUniforms (const vector<BasicUniform>& basicUniforms, deUint32 programGL, Random& rnd)
{
	TestLog&				log				= m_testCtx.getLog();
	const bool				transpose		= (m_features & FEATURE_MATRIXMODE_ROWMAJOR) != 0;
	const GLboolean			transposeGL		= transpose ? GL_TRUE : GL_FALSE;
	const glu::DataType		boolApiType		= m_features & FEATURE_BOOLEANAPITYPE_INT	? glu::TYPE_INT
											: m_features & FEATURE_BOOLEANAPITYPE_UINT	? glu::TYPE_UINT
											:											  glu::TYPE_FLOAT;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform				= basicUniforms[unifNdx];
		const bool				isArrayMember		= uniform.elemNdx >= 0;
		const string			queryName			= m_features & FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX && uniform.elemNdx == 0 ? beforeLast(uniform.name, '[') : uniform.name;
		const int				numValuesToAssign	= !isArrayMember									? 1
													: m_features & FEATURE_ARRAYASSIGN_FULL				? (uniform.elemNdx == 0			? uniform.rootSize	: 0)
													: m_features & FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO	? (uniform.elemNdx % 2 == 0		? 2					: 0)
													: /* Default: assign array elements separately */	  1;

		DE_ASSERT(numValuesToAssign >= 0);
		DE_ASSERT(numValuesToAssign == 1 || isArrayMember);

		if (numValuesToAssign == 0)
		{
			log << TestLog::Message << "// Uniform " << uniform.name << " is covered by another glProgramUniform*v() call to the same array" << TestLog::EndMessage;
			continue;
		}

		const int			location			= glGetUniformLocation(programGL, queryName.c_str());
		const int			typeSize			= glu::getDataTypeScalarSize(uniform.type);
		const bool			assignByValue		= m_features & FEATURE_UNIFORMFUNC_VALUE && !glu::isDataTypeMatrix(uniform.type) && numValuesToAssign == 1;
		vector<VarValue>	valuesToAssign;

		for (int i = 0; i < numValuesToAssign; i++)
		{
			const string	curName = isArrayMember ? beforeLast(uniform.rootName, '[') + "[" + de::toString(uniform.elemNdx+i) + "]" : uniform.name;
			VarValue		unifValue;

			if (isArrayMember)
			{
				const vector<BasicUniform>::const_iterator elemUnif = BasicUniform::findWithName(basicUniforms, curName.c_str());
				if (elemUnif == basicUniforms.end())
					continue;
				unifValue = elemUnif->finalValue;
			}
			else
				unifValue = uniform.finalValue;

			const VarValue apiValue = glu::isDataTypeBoolOrBVec(unifValue.type)	? getRandomBoolRepresentation(unifValue, boolApiType, rnd)
									: glu::isDataTypeSampler(unifValue.type)	? getSamplerUnitValue(unifValue)
									: unifValue;

			valuesToAssign.push_back(glu::isDataTypeMatrix(apiValue.type) && transpose ? getTransposeMatrix(apiValue) : apiValue);

			if (glu::isDataTypeBoolOrBVec(uniform.type))
				log << TestLog::Message << "// Using type " << glu::getDataTypeName(boolApiType) << " to set boolean value " << apiVarValueStr(unifValue) << " for " << curName << TestLog::EndMessage;
			else if (glu::isDataTypeSampler(uniform.type))
				log << TestLog::Message << "// Texture for the sampler uniform " << curName << " will be filled with color " << apiVarValueStr(getSamplerFillValue(uniform.finalValue)) << TestLog::EndMessage;
		}

		DE_ASSERT(!valuesToAssign.empty());

		if (glu::isDataTypeFloatOrVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const float* const ptr = &valuesToAssign[0].val.floatV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1f(programGL, location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glProgramUniform2f(programGL, location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glProgramUniform3f(programGL, location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glProgramUniform4f(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<float> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glProgramUniform2fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glProgramUniform3fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glProgramUniform4fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeMatrix(valuesToAssign[0].type))
		{
			DE_ASSERT(!assignByValue);

			vector<float> buffer(valuesToAssign.size() * typeSize);
			for (int i = 0; i < (int)buffer.size(); i++)
				buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

			DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(buffer[0]));
			switch (uniform.type)
			{
				case glu::TYPE_FLOAT_MAT2:		GLU_CHECK_CALL(glProgramUniformMatrix2fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3:		GLU_CHECK_CALL(glProgramUniformMatrix3fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4:		GLU_CHECK_CALL(glProgramUniformMatrix4fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT2X3:	GLU_CHECK_CALL(glProgramUniformMatrix2x3fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT2X4:	GLU_CHECK_CALL(glProgramUniformMatrix2x4fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3X2:	GLU_CHECK_CALL(glProgramUniformMatrix3x2fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3X4:	GLU_CHECK_CALL(glProgramUniformMatrix3x4fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4X2:	GLU_CHECK_CALL(glProgramUniformMatrix4x2fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4X3:	GLU_CHECK_CALL(glProgramUniformMatrix4x3fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				default:
					DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeIntOrIVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const deInt32* const ptr = &valuesToAssign[0].val.intV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1i(programGL, location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glProgramUniform2i(programGL, location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glProgramUniform3i(programGL, location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glProgramUniform4i(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<deInt32> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.intV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLint) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glProgramUniform2iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glProgramUniform3iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glProgramUniform4iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeUintOrUVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const deUint32* const ptr = &valuesToAssign[0].val.uintV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1ui(programGL, location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glProgramUniform2ui(programGL, location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glProgramUniform3ui(programGL, location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glProgramUniform4ui(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<deUint32> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.intV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLuint) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glProgramUniform2uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glProgramUniform3uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glProgramUniform4uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeSampler(valuesToAssign[0].type))
		{
			if (assignByValue)
				GLU_CHECK_CALL(glProgramUniform1i(programGL, location, uniform.finalValue.val.samplerV.unit));
			else
			{
				const GLint unit = uniform.finalValue.val.samplerV.unit;
				GLU_CHECK_CALL(glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &unit));
			}
		}
		else
			DE_ASSERT(false);
	}
}